

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NMEADevice.cpp
# Opt level: O1

void * NMEADeviceThread(void *pParam)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  bool bVar4;
  double dVar5;
  double dVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  tm *ptVar11;
  size_t sVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  int iVar17;
  ulong uVar18;
  char *pcVar19;
  double dVar20;
  double dVar21;
  time_t tt;
  tm t;
  CHRONO chrono_period;
  char szTemp [256];
  NMEADATA nmeadata;
  NMEADEVICE nmeadevice;
  char szCfgFilePath [256];
  char szSaveFilePath [256];
  double local_1188;
  interval local_1168;
  int local_114c;
  time_t local_1148;
  double local_1140;
  double local_1138;
  double local_1130;
  tm local_1128;
  double local_10e8;
  timespec local_10e0;
  double local_10d0;
  double dStack_10c8;
  double local_10c0;
  double dStack_10b8;
  timespec local_10b0;
  int local_10a0;
  double local_1098;
  double local_1090;
  interval local_1088;
  interval local_1070;
  timeval local_1058;
  char local_1048 [264];
  NMEADATA local_f40;
  NMEADEVICE local_b68;
  char local_238 [256];
  char local_138 [264];
  
  local_1148 = 0;
  iVar17 = (int)pParam;
  sprintf(local_238,"NMEADevice%d.txt",(ulong)pParam & 0xffffffff);
  memset(&local_b68,0,0x930);
  GNSSqualityNMEADevice[iVar17] = 0;
  iVar7 = clock_getres(4,&local_10b0);
  if ((iVar7 == 0) && (iVar7 = clock_gettime(4,&local_10e0), iVar7 == 0)) {
    local_10a0 = 0;
    local_10d0 = 0.0;
    dStack_10c8 = 0.0;
    local_10c0 = 0.0;
    dStack_10b8 = 0.0;
  }
  iVar7 = 100;
  bVar3 = false;
  local_114c = 0;
  do {
    while( true ) {
      if (local_10a0 == 0) {
        clock_gettime(4,(timespec *)&local_1168);
        local_10d0 = local_1168.inf;
        dStack_10c8 = local_1168.sup;
        local_1168.inf =
             (double)(((long)local_1168.inf + (long)local_10c0 +
                      ((long)local_1168.sup + (long)dStack_10b8) / 1000000000) - local_10e0.tv_sec);
        local_1168.sup =
             (double)(((long)local_1168.sup + (long)dStack_10b8) % 1000000000 - local_10e0.tv_nsec);
        if ((long)local_1168.sup < 0) {
          local_1168.inf = (double)((long)local_1168.inf + (long)local_1168.sup / 1000000000 + -1);
          local_1168.sup = (double)((long)local_1168.sup % 1000000000 + 1000000000);
        }
        local_10c0 = local_1168.inf;
        dStack_10b8 = local_1168.sup;
      }
      iVar8 = clock_getres(4,&local_10b0);
      if ((iVar8 == 0) && (iVar8 = clock_gettime(4,&local_10e0), iVar8 == 0)) {
        local_10a0 = 0;
        local_10c0 = 0.0;
        dStack_10b8 = 0.0;
        local_10d0 = 0.0;
        dStack_10c8 = 0.0;
      }
      local_1168.inf = (double)((long)iVar7 / 1000);
      local_1168.sup = (double)(((long)iVar7 % 1000) * 1000000);
      nanosleep((timespec *)&local_1168,(timespec *)0x0);
      if (bPauseNMEADevice[iVar17] == 0) break;
      if (bVar3) {
        puts("NMEADevice paused.");
        GNSSqualityNMEADevice[iVar17] = 0;
        iVar8 = CloseRS232Port(&local_b68.RS232Port);
        pcVar19 = "NMEADevice disconnection failed.";
        if (iVar8 == 0) {
          pcVar19 = "NMEADevice disconnected.";
        }
        puts(pcVar19);
      }
      if (bExit != 0) {
        bVar4 = true;
        goto LAB_00162a98;
      }
      local_1168.inf = 0.0;
      local_1168.sup = 4.94065645841247e-316;
      bVar3 = false;
      nanosleep((timespec *)&local_1168,(timespec *)0x0);
    }
    if (bRestartNMEADevice[iVar17] != 0) {
      if (bVar3) {
        puts("Restarting a NMEADevice.");
        GNSSqualityNMEADevice[iVar17] = 0;
        iVar8 = CloseRS232Port(&local_b68.RS232Port);
        pcVar19 = "NMEADevice disconnection failed.";
        if (iVar8 == 0) {
          pcVar19 = "NMEADevice disconnected.";
        }
        puts(pcVar19);
      }
      bRestartNMEADevice[iVar17] = 0;
      bVar3 = false;
    }
    if (bVar3) {
      iVar8 = GetLatestDataNMEADevice(&local_b68,&local_f40);
      if (iVar8 == 0) {
        pthread_mutex_lock((pthread_mutex_t *)&StateVariablesCS);
        if ((local_f40.GPS_quality_indicator < 1) && (local_f40.status != 'A')) {
          GNSSqualityNMEADevice[iVar17] = 0;
        }
        else {
          GNSSqualityNMEADevice[iVar17] = 1;
          dVar1 = angle_env;
          dVar21 = local_f40.Longitude - long_env;
          dVar20 = local_f40.Latitude - lat_env;
          local_1098 = local_f40.Altitude - alt_env;
          local_10e8 = cos(local_f40.Latitude * 0.017453292519943295);
          local_10e8 = local_10e8 * dVar21 * 111194.92664455874;
          dVar20 = dVar20 * 111194.92664455874;
          local_1188 = -dVar1;
          local_1140 = cos(-dVar1);
          dVar1 = sin(local_1188);
          local_1140 = local_1140 * local_10e8 - dVar1 * dVar20;
          dVar1 = sin(local_1188);
          dVar21 = cos(local_1188);
          dVar20 = dVar1 * local_10e8 + dVar21 * dVar20;
          local_1070.inf = local_1140 - GPS_med_acc;
          local_1088.inf = local_1140 + GPS_med_acc;
          interval::interval(&local_1168,&local_1070.inf,&local_1088.inf);
          interval::operator=((interval *)&x_gps,&local_1168);
          local_1070.inf = dVar20 - GPS_med_acc;
          local_1088.inf = dVar20 + GPS_med_acc;
          interval::interval(&local_1168,&local_1070.inf,&local_1088.inf);
          interval::operator=((interval *)&y_gps,&local_1168);
          local_1070.inf = GPS_med_acc * -5.0 + local_1098;
          local_1088.inf = GPS_med_acc * 5.0 + local_1098;
          interval::interval(&local_1168,&local_1070.inf,&local_1088.inf);
          interval::operator=((interval *)&z_gps,&local_1168);
          if ((local_b68.bEnableGPRMC == 0) &&
             (local_b68.bEnableGPGLL != 0 || local_b68.bEnableGPGGA != 0)) {
            local_1128._32_8_ = 0;
            local_1128.tm_gmtoff = 0;
            local_1128.tm_mon = 0;
            local_1128.tm_year = 0;
            local_1128.tm_wday = 0;
            local_1128.tm_yday = 0;
            local_1128.tm_sec = 0;
            local_1128.tm_min = 0;
            local_1128.tm_hour = 0;
            local_1128.tm_mday = 0;
            local_1128.tm_zone = (char *)0x0;
            iVar8 = gettimeofday(&local_1058,(__timezone_ptr_t)0x0);
            if (iVar8 != 0) {
              local_1058.tv_sec = 0;
              local_1058.tv_usec = 0;
            }
            local_1148 = local_1058.tv_sec;
            ptVar11 = gmtime(&local_1148);
            if (ptVar11 != (tm *)0x0) {
              local_1128.tm_mon = ptVar11->tm_mon;
              local_1128.tm_year = ptVar11->tm_year;
              local_1128.tm_mday = ptVar11->tm_mday;
            }
            local_1128.tm_min = local_f40.minute;
            local_1128.tm_hour = local_f40.hour;
            local_1128.tm_sec = 0;
            local_1128._32_8_ = local_1128._32_8_ & 0xffffffff00000000;
            local_1148 = timegm(&local_1128);
            utc = (double)local_1148 * 1000.0 + local_f40.second * 1000.0;
          }
        }
        if ((local_b68.bEnableGPRMC != 0 && local_f40.status == 'A') ||
           (local_b68.bEnableGPVTG != 0)) {
          sog = local_f40.SOG;
          dVar20 = fmod((1.5707963267948966 - local_f40.COG) - angle_env,6.283185307179586);
          local_1130 = fmod(dVar20 + 9.42477796076938,6.283185307179586);
          local_1130 = local_1130 + -3.141592653589793;
          interval::interval(&local_1070,&local_1130);
          local_1138 = -3.141592653589793;
          local_1090 = 3.141592653589793;
          interval::interval(&local_1088,&local_1138,&local_1090);
          operator+(&local_1070,&local_1088);
          interval::operator=((interval *)&cog_gps,&local_1168);
        }
        if ((local_b68.bEnableGPRMC != 0) && (local_f40.status == 'A')) {
          local_1128.tm_wday = 0;
          local_1128.tm_yday = 0;
          local_1128.tm_gmtoff = 0;
          local_1128.tm_zone = (char *)0x0;
          local_1128.tm_year = local_f40.year + -0x76c;
          local_1128.tm_mon = local_f40.month + -1;
          local_1128.tm_mday = local_f40.day;
          local_1128.tm_min = local_f40.minute;
          local_1128.tm_hour = local_f40.hour;
          local_1128.tm_sec = 0;
          local_1128._32_8_ = 0;
          local_1148 = timegm(&local_1128);
          utc = (double)local_1148 * 1000.0 + local_f40.second * 1000.0;
        }
        if ((local_b68.bEnableHCHDG != 0) && (robid == 0x8000)) {
          dVar20 = fmod((1.5707963267948966 - local_f40.Heading) - angle_env,6.283185307179586);
          local_1130 = fmod(dVar20 + 9.42477796076938,6.283185307179586);
          local_1130 = local_1130 + -3.141592653589793;
          interval::interval(&local_1070,&local_1130);
          local_1138 = -psi_ahrs_acc;
          interval::interval(&local_1088,&local_1138,&psi_ahrs_acc);
          operator+(&local_1070,&local_1088);
          interval::operator=((interval *)&psi_ahrs,&local_1168);
        }
        if (local_b68.bEnableWIMWV != 0 || local_b68.bEnableIIMWV != 0) {
          dVar20 = fmod(3.141592653589793 - local_f40.ApparentWindDir,6.283185307179586);
          dVar20 = fmod(dVar20 + 9.42477796076938,6.283185307179586);
          dVar20 = dVar20 + -3.141592653589793;
          vawind = local_f40.ApparentWindSpeed;
          psiawind = dVar20;
          if (bDisableRollWindCorrectionSailboat == 0) {
            dVar20 = sin(dVar20);
            dVar1 = Center((interval *)&phi_ahrs);
            dVar1 = cos(dVar1);
            dVar21 = cos(psiawind);
            dVar20 = atan2(dVar20,dVar1 * dVar21);
            dVar1 = Center((interval *)&psi_ahrs);
            dVar20 = fmod(dVar1 + dVar20,6.283185307179586);
            dVar20 = fmod(dVar20 + 9.42477796076938,6.283185307179586);
            dVar1 = vawind;
            psitwind = dVar20 + -3.141592653589793;
            if ((vawind <= 0.0) || (sog < GPS_SOG_for_valid_COG)) goto LAB_001627ff;
            dVar20 = sin(psitwind);
            dVar5 = sog;
            dVar21 = Center((interval *)&cog_gps);
            dVar21 = sin(dVar21);
            dVar6 = vawind;
            dVar2 = cos(psitwind);
            dVar20 = atan2(dVar21 * dVar5 + dVar1 * dVar20,dVar6 * dVar2);
            dVar21 = sog;
            dVar1 = Center((interval *)&cog_gps);
            dVar1 = cos(dVar1);
            dVar20 = dVar1 * dVar21 + dVar20;
          }
          else {
            dVar1 = Center((interval *)&psi_ahrs);
            dVar20 = dVar20 + dVar1;
          }
          dVar20 = fmod(dVar20,6.283185307179586);
          dVar20 = fmod(dVar20 + 9.42477796076938,6.283185307179586);
          psitwind = dVar20 + -3.141592653589793;
        }
LAB_001627ff:
        if (local_b68.bEnableWIMDA != 0 || local_b68.bEnableWIMWD != 0) {
          dVar20 = fmod(((1.5707963267948966 - local_f40.WindDir) + 3.141592653589793) - angle_env,
                        6.283185307179586);
          dVar20 = fmod(dVar20 + 9.42477796076938,6.283185307179586);
          psitwind = dVar20 + -3.141592653589793;
          vtwind = local_f40.WindSpeed;
        }
        pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
        bVar3 = true;
        bVar4 = false;
      }
      else {
        puts("Connection to a NMEADevice lost.");
        GNSSqualityNMEADevice[iVar17] = 0;
        iVar8 = CloseRS232Port(&local_b68.RS232Port);
        if (iVar8 == 0) {
          pcVar19 = "NMEADevice disconnected.";
        }
        else {
          pcVar19 = "NMEADevice disconnection failed.";
        }
        puts(pcVar19);
LAB_00161feb:
        bVar3 = false;
        bVar4 = true;
      }
    }
    else {
      iVar9 = ConnectNMEADevice(&local_b68,local_238);
      iVar8 = local_b68.threadperiod;
      if (iVar9 != 0) {
        GNSSqualityNMEADevice[iVar17] = 0;
        local_1168.inf = 4.94065645841247e-324;
        local_1168.sup = 0.0;
        nanosleep((timespec *)&local_1168,(timespec *)0x0);
        goto LAB_00161feb;
      }
      memset(&local_f40,0,0x3d8);
      if ((FILE *)local_b68.pfSaveFile != (FILE *)0x0) {
        fclose((FILE *)local_b68.pfSaveFile);
        local_b68.pfSaveFile = (FILE *)0x0;
      }
      bVar4 = false;
      bVar3 = true;
      iVar7 = iVar8;
      if ((local_b68.bSaveRawData != 0) && ((FILE *)local_b68.pfSaveFile == (FILE *)0x0)) {
        if (local_b68.szCfgFilePath[0] == '\0') {
          builtin_strncpy(local_1048,"nmeadevice",0xb);
        }
        else {
          sprintf(local_1048,"%.127s",local_b68.szCfgFilePath);
        }
        sVar12 = strlen(local_1048);
        uVar10 = (uint)sVar12;
        uVar18 = sVar12 & 0xffffffff;
        uVar13 = (int)uVar10 >> 0x1f & uVar10;
        uVar16 = sVar12 & 0xffffffff;
        do {
          uVar18 = uVar18 - 1;
          uVar15 = (uint)uVar16;
          uVar16 = (ulong)(uVar13 - 1);
          uVar14 = uVar13;
          if ((int)uVar15 < 1) break;
          uVar16 = (ulong)(uVar15 - 1);
          uVar14 = uVar15;
        } while (local_1048[uVar18 & 0xffffffff] != '.');
        if ((int)uVar14 <= (int)uVar10 && 1 < (int)uVar14) {
          memset(local_1048 + uVar16,0,sVar12 - uVar16);
        }
        pthread_mutex_lock((pthread_mutex_t *)&strtimeCS);
        pcVar19 = strtimeex_fns();
        bVar4 = false;
        sprintf(local_138,"log/%.127s_%.64s.txt",local_1048,pcVar19);
        pthread_mutex_unlock((pthread_mutex_t *)&strtimeCS);
        local_b68.pfSaveFile = (FILE *)fopen(local_138,"wb");
        if ((FILE *)local_b68.pfSaveFile == (FILE *)0x0) {
          puts("Unable to create NMEADevice data file.");
          bVar4 = false;
          goto LAB_00162a98;
        }
      }
    }
    if ((bVar4) &&
       (local_114c = local_114c + 1, ExitOnErrorCount <= local_114c && 0 < ExitOnErrorCount)) {
      bExit = 1;
    }
    if (bExit != 0) {
LAB_00162a98:
      if (local_10a0 == 0) {
        clock_gettime(4,(timespec *)&local_1168);
        local_10d0 = local_1168.inf;
        dStack_10c8 = local_1168.sup;
        local_1168.inf =
             (double)(((long)local_1168.inf + (long)local_10c0 +
                      ((long)local_1168.sup + (long)dStack_10b8) / 1000000000) - local_10e0.tv_sec);
        local_1168.sup =
             (double)(((long)local_1168.sup + (long)dStack_10b8) % 1000000000 - local_10e0.tv_nsec);
        if ((long)local_1168.sup < 0) {
          local_1168.inf = (double)((long)local_1168.inf + (long)local_1168.sup / 1000000000 + -1);
          local_1168.sup = (double)((long)local_1168.sup % 1000000000 + 1000000000);
        }
        local_10c0 = local_1168.inf;
        dStack_10b8 = local_1168.sup;
      }
      GNSSqualityNMEADevice[iVar17] = 0;
      if ((FILE *)local_b68.pfSaveFile != (FILE *)0x0) {
        fclose((FILE *)local_b68.pfSaveFile);
        local_b68.pfSaveFile = (FILE *)0x0;
      }
      if (!bVar4) {
        iVar7 = CloseRS232Port(&local_b68.RS232Port);
        pcVar19 = "NMEADevice disconnection failed.";
        if (iVar7 == 0) {
          pcVar19 = "NMEADevice disconnected.";
        }
        puts(pcVar19);
      }
      if (bExit == 0) {
        bExit = 1;
      }
      return (void *)0x0;
    }
  } while( true );
}

Assistant:

THREAD_PROC_RETURN_VALUE NMEADeviceThread(void* pParam)
{
	NMEADEVICE nmeadevice;
	NMEADATA nmeadata;
	struct tm t;
	time_t tt = 0;
	struct timeval tv;
	struct tm* timeptr = NULL;
	BOOL bConnected = FALSE;
	CHRONO chrono_period;
	int threadperiod = 100;
	int errcount = 0;
	int deviceid = (int)(intptr_t)pParam;
	char szCfgFilePath[256];
	int i = 0;
	char szSaveFilePath[256];
	char szTemp[256];

	sprintf(szCfgFilePath, "NMEADevice%d.txt", deviceid);

	memset(&nmeadevice, 0, sizeof(NMEADEVICE));

	GNSSqualityNMEADevice[deviceid] = GNSS_NO_FIX;

	StartChrono(&chrono_period);

	for (;;)
	{
		StopChronoQuick(&chrono_period);
		StartChrono(&chrono_period);

		mSleep(threadperiod);

		if (bPauseNMEADevice[deviceid])
		{
			if (bConnected)
			{
				printf("NMEADevice paused.\n");
				GNSSqualityNMEADevice[deviceid] = GNSS_NO_FIX;
				bConnected = FALSE;
				DisconnectNMEADevice(&nmeadevice);
			}
			if (bExit) break;
			mSleep(100);
			continue;
		}

		if (bRestartNMEADevice[deviceid])
		{
			if (bConnected)
			{
				printf("Restarting a NMEADevice.\n");
				GNSSqualityNMEADevice[deviceid] = GNSS_NO_FIX;
				bConnected = FALSE;
				DisconnectNMEADevice(&nmeadevice);
			}
			bRestartNMEADevice[deviceid] = FALSE;
		}

		if (!bConnected)
		{
			if (ConnectNMEADevice(&nmeadevice, szCfgFilePath) == EXIT_SUCCESS) 
			{
				bConnected = TRUE; 
				threadperiod = nmeadevice.threadperiod;

				memset(&nmeadata, 0, sizeof(nmeadata));

				if (nmeadevice.pfSaveFile != NULL)
				{
					fclose(nmeadevice.pfSaveFile); 
					nmeadevice.pfSaveFile = NULL;
				}
				if ((nmeadevice.bSaveRawData)&&(nmeadevice.pfSaveFile == NULL)) 
				{
					if (strlen(nmeadevice.szCfgFilePath) > 0)
					{
						sprintf(szTemp, "%.127s", nmeadevice.szCfgFilePath);
					}
					else
					{
						sprintf(szTemp, "nmeadevice");
					}
					// Remove the extension.
					for (i = (int)strlen(szTemp)-1; i >= 0; i--) { if (szTemp[i] == '.') break; }
					if ((i > 0)&&(i < (int)strlen(szTemp))) memset(szTemp+i, 0, strlen(szTemp)-i);
					//if (strlen(szTemp) > 4) memset(szTemp+strlen(szTemp)-4, 0, 4);
					EnterCriticalSection(&strtimeCS);
					sprintf(szSaveFilePath, LOG_FOLDER"%.127s_%.64s.txt", szTemp, strtimeex_fns());
					LeaveCriticalSection(&strtimeCS);
					nmeadevice.pfSaveFile = fopen(szSaveFilePath, "wb");
					if (nmeadevice.pfSaveFile == NULL) 
					{
						printf("Unable to create NMEADevice data file.\n");
						break;
					}
				}
			}
			else 
			{
				GNSSqualityNMEADevice[deviceid] = GNSS_NO_FIX;
				bConnected = FALSE;
				mSleep(1000);
			}
		}
		else
		{
			if (GetLatestDataNMEADevice(&nmeadevice, &nmeadata) == EXIT_SUCCESS)
			{
				EnterCriticalSection(&StateVariablesCS);

				//printf("GPS_quality_indicator : %d, status : %c\n", nmeadata.GPS_quality_indicator, nmeadata.status);

				if ((nmeadata.GPS_quality_indicator > 0)||(nmeadata.status == 'A'))
				{
					GNSSqualityNMEADevice[deviceid] = AUTONOMOUS_GNSS_FIX;

					// Old...

					double x_gps_mes = 0, y_gps_mes = 0, z_gps_mes = 0;
					GPS2EnvCoordSystem(lat_env, long_env, alt_env, angle_env, nmeadata.Latitude, nmeadata.Longitude, nmeadata.Altitude, &x_gps_mes, &y_gps_mes, &z_gps_mes);
					// Default accuracy...
					x_gps = interval(x_gps_mes-GPS_med_acc, x_gps_mes+GPS_med_acc);
					y_gps = interval(y_gps_mes-GPS_med_acc, y_gps_mes+GPS_med_acc);
					z_gps = interval(z_gps_mes-5*GPS_med_acc, z_gps_mes+5*GPS_med_acc);

					if ((!nmeadevice.bEnableGPRMC)&&(nmeadevice.bEnableGPGGA||nmeadevice.bEnableGPGLL))
					{
						// Try to extrapolate UTC as ms from the computer date since not all the time and date data are available in GGA or GLL...
						memset(&t, 0, sizeof(t));
						if (gettimeofday(&tv, NULL) != EXIT_SUCCESS) { tv.tv_sec = 0; tv.tv_usec = 0; }
						tt = tv.tv_sec;
						timeptr = gmtime(&tt);
						if (timeptr != NULL)
						{
							t.tm_year = timeptr->tm_year; t.tm_mon = timeptr->tm_mon; t.tm_mday = timeptr->tm_mday;
						}
						t.tm_hour = nmeadata.hour; t.tm_min = nmeadata.minute; t.tm_sec = 0; t.tm_isdst = 0;
						tt = timegm(&t);
						utc = tt*1000.0+nmeadata.second*1000.0;
					}
				}
				else
				{
					GNSSqualityNMEADevice[deviceid] = GNSS_NO_FIX;
				}

				// Should check better if valid...
				if ((nmeadevice.bEnableGPRMC&&(nmeadata.status == 'A'))||nmeadevice.bEnableGPVTG)
				{
					sog = nmeadata.SOG;
					cog_gps = fmod_2PI(M_PI/2.0-nmeadata.COG-angle_env)+interval(-M_PI,M_PI);
				}

				if (nmeadevice.bEnableGPRMC&&(nmeadata.status == 'A'))
				{
					// Get UTC as ms.
					memset(&t, 0, sizeof(t));
					t.tm_year = nmeadata.year-1900; t.tm_mon = nmeadata.month-1; t.tm_mday = nmeadata.day; 
					t.tm_hour = nmeadata.hour; t.tm_min = nmeadata.minute; t.tm_sec = 0; t.tm_isdst = 0;
					tt = timegm(&t);
					utc = tt*1000.0+nmeadata.second*1000.0;
				}

				if (nmeadevice.bEnableHCHDG)
				{
					if (robid == SAILBOAT2_ROBID) psi_ahrs = fmod_2PI(M_PI/2.0-nmeadata.Heading-angle_env)+interval(-psi_ahrs_acc, psi_ahrs_acc);
				}

				if (nmeadevice.bEnableIIMWV||nmeadevice.bEnableWIMWV)
				{
					// Apparent wind (in robot coordinate system).
					psiawind = fmod_2PI(-nmeadata.ApparentWindDir+M_PI); 
					vawind = nmeadata.ApparentWindSpeed;
					// True wind must be computed from apparent wind.
					if (bDisableRollWindCorrectionSailboat)
						psitwind = fmod_2PI(psiawind+Center(psi_ahrs)); // Robot speed and roll not taken into account...
					else
					{
						psitwind = fmod_2PI(atan2(sin(psiawind),cos(Center(phi_ahrs))*cos(psiawind))+Center(psi_ahrs)); // Robot speed not taken into account, but with roll correction...
						if ((vawind > 0)&&(sog >= GPS_SOG_for_valid_COG))
						{
							psitwind = fmod_2PI(atan2(vawind*sin(psitwind)+sog*sin(Center(cog_gps)),vawind*cos(psitwind))+sog*cos(Center(cog_gps))); // With speed correction...
						}
					}
				}

				if (nmeadevice.bEnableWIMWD||nmeadevice.bEnableWIMDA)
				{
					// True wind.
					psitwind = fmod_2PI(M_PI/2.0-nmeadata.WindDir+M_PI-angle_env);
					vtwind = nmeadata.WindSpeed;
				}

				LeaveCriticalSection(&StateVariablesCS);
			}
			else
			{
				printf("Connection to a NMEADevice lost.\n");
				GNSSqualityNMEADevice[deviceid] = GNSS_NO_FIX;
				bConnected = FALSE;
				DisconnectNMEADevice(&nmeadevice);
			}		
		}

		//printf("NMEADeviceThread period : %f s.\n", GetTimeElapsedChronoQuick(&chrono_period));
		if (!bConnected) { errcount++; if ((ExitOnErrorCount > 0)&&(errcount >= ExitOnErrorCount)) bExit = TRUE; }
		if (bExit) break;
	}

	StopChronoQuick(&chrono_period);

	GNSSqualityNMEADevice[deviceid] = GNSS_NO_FIX;

	if (nmeadevice.pfSaveFile != NULL)
	{
		fclose(nmeadevice.pfSaveFile); 
		nmeadevice.pfSaveFile = NULL;
	}

	if (bConnected) DisconnectNMEADevice(&nmeadevice);

	if (!bExit) bExit = TRUE; // Unexpected program exit...

	return 0;
}